

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_queue_remove_timeout(event_base *base,event *ev)

{
  short *psVar1;
  ushort uVar2;
  event *peVar3;
  event *peVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  event **ppeVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar16;
  bool bVar17;
  ulong uVar15;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar8 = evthread_is_debug_lock_held_(base->th_base_lock), iVar8 == 0)) {
LAB_002cfd11:
    event_queue_remove_timeout_cold_2();
  }
  uVar2 = (ev->ev_evcallback).evcb_flags;
  if ((uVar2 & 1) == 0) {
    event_queue_remove_timeout_cold_1();
    goto LAB_002cfd11;
  }
  base->event_count = base->event_count - (uint)((uVar2 & 0x10) == 0);
  psVar1 = &(ev->ev_evcallback).evcb_flags;
  *(byte *)psVar1 = (byte)*psVar1 & 0xfe;
  uVar12 = (ev->ev_timeout).tv_usec;
  if ((((uint)uVar12 & 0xf0000000) == 0x50000000) &&
     ((int)((uint)(uVar12 >> 0x14) & 0xff) < base->n_common_timeouts)) {
    peVar3 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    if (peVar3 == (event *)0x0) {
      ppeVar9 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
      *(event ***)
       (*(long *)((long)base->common_timeout_queues + (ulong)((uint)(uVar12 >> 0x11) & 0x7f8)) + 8)
           = ppeVar9;
    }
    else {
      ppeVar9 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
      (peVar3->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev = ppeVar9;
    }
    *ppeVar9 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    return;
  }
  if ((ev->ev_timeout_pos).min_heap_idx == -1) {
    return;
  }
  ppeVar9 = (base->timeheap).p;
  uVar14 = (base->timeheap).n - 1;
  uVar15 = (ulong)uVar14;
  (base->timeheap).n = uVar14;
  peVar3 = ppeVar9[uVar15];
  uVar10 = (ev->ev_timeout_pos).min_heap_idx;
  uVar12 = (ulong)(int)uVar10;
  if (0 < (long)uVar12) {
    uVar13 = uVar10 - 1 >> 1;
    uVar11 = (ulong)uVar13;
    peVar4 = ppeVar9[uVar11];
    lVar5 = (peVar3->ev_timeout).tv_sec;
    lVar6 = (peVar4->ev_timeout).tv_sec;
    bVar17 = SBORROW8(lVar6,lVar5);
    lVar7 = lVar6 - lVar5;
    bVar16 = lVar6 == lVar5;
    if (bVar16) {
      lVar5 = (peVar4->ev_timeout).tv_usec;
      lVar6 = (peVar3->ev_timeout).tv_usec;
      bVar17 = SBORROW8(lVar5,lVar6);
      lVar7 = lVar5 - lVar6;
      bVar16 = lVar5 == lVar6;
    }
    if (!bVar16 && bVar17 == lVar7 < 0) {
      ppeVar9[uVar12] = peVar4;
      (peVar4->ev_timeout_pos).min_heap_idx = uVar10;
      if (2 < uVar10) {
        do {
          uVar10 = (uint)uVar11;
          uVar14 = uVar10 - 1 >> 1;
          uVar12 = (ulong)uVar14;
          ppeVar9 = (base->timeheap).p;
          peVar4 = ppeVar9[uVar12];
          lVar5 = (peVar3->ev_timeout).tv_sec;
          lVar6 = (peVar4->ev_timeout).tv_sec;
          bVar17 = SBORROW8(lVar6,lVar5);
          lVar7 = lVar6 - lVar5;
          bVar16 = lVar6 == lVar5;
          if (bVar16) {
            lVar5 = (peVar4->ev_timeout).tv_usec;
            lVar6 = (peVar3->ev_timeout).tv_usec;
            bVar17 = SBORROW8(lVar5,lVar6);
            lVar7 = lVar5 - lVar6;
            bVar16 = lVar5 == lVar6;
          }
          uVar13 = uVar10;
          if (bVar16 || bVar17 != lVar7 < 0) break;
          ppeVar9[uVar11] = peVar4;
          (peVar4->ev_timeout_pos).min_heap_idx = uVar10;
          uVar11 = uVar12;
          uVar13 = uVar14;
        } while (1 < uVar10 - 1);
      }
      ppeVar9 = (base->timeheap).p + uVar11;
      goto LAB_002cfcf4;
    }
  }
  uVar13 = uVar10 * 2 + 2;
  if (uVar14 < uVar13) {
LAB_002cfbf5:
    uVar11 = uVar12 & 0xffffffff;
  }
  else {
    do {
      ppeVar9 = (base->timeheap).p;
      iVar8 = -1;
      if (uVar13 != (uint)uVar15) {
        lVar5 = (ppeVar9[(ulong)(uVar10 * 2) + 1]->ev_timeout).tv_sec;
        lVar6 = (ppeVar9[uVar13]->ev_timeout).tv_sec;
        bVar17 = SBORROW8(lVar6,lVar5);
        lVar7 = lVar6 - lVar5;
        bVar16 = lVar6 == lVar5;
        if (bVar16) {
          lVar5 = (ppeVar9[uVar13]->ev_timeout).tv_usec;
          lVar6 = (ppeVar9[(ulong)(uVar10 * 2) + 1]->ev_timeout).tv_usec;
          bVar17 = SBORROW8(lVar5,lVar6);
          lVar7 = lVar5 - lVar6;
          bVar16 = lVar5 == lVar6;
        }
        iVar8 = -(uint)(!bVar16 && bVar17 == lVar7 < 0);
      }
      uVar10 = iVar8 + uVar13;
      uVar11 = (ulong)uVar10;
      peVar4 = ppeVar9[uVar11];
      lVar5 = (peVar4->ev_timeout).tv_sec;
      lVar6 = (peVar3->ev_timeout).tv_sec;
      bVar17 = SBORROW8(lVar6,lVar5);
      lVar7 = lVar6 - lVar5;
      bVar16 = lVar6 == lVar5;
      if (bVar16) {
        lVar5 = (peVar3->ev_timeout).tv_usec;
        lVar6 = (peVar4->ev_timeout).tv_usec;
        bVar17 = SBORROW8(lVar5,lVar6);
        lVar7 = lVar5 - lVar6;
        bVar16 = lVar5 == lVar6;
      }
      if (bVar16 || bVar17 != lVar7 < 0) goto LAB_002cfbf5;
      ppeVar9[uVar12 & 0xffffffff] = peVar4;
      (peVar4->ev_timeout_pos).min_heap_idx = (int)uVar12;
      uVar13 = uVar10 * 2 + 2;
      uVar14 = (base->timeheap).n;
      uVar15 = (ulong)uVar14;
      uVar12 = (ulong)uVar10;
    } while (uVar13 <= uVar14);
    ppeVar9 = (base->timeheap).p;
  }
  uVar13 = (uint)uVar11;
  ppeVar9 = ppeVar9 + uVar11;
LAB_002cfcf4:
  *ppeVar9 = peVar3;
  (peVar3->ev_timeout_pos).min_heap_idx = uVar13;
  (ev->ev_timeout_pos).min_heap_idx = -1;
  return;
}

Assistant:

static void
event_queue_remove_timeout(struct event_base *base, struct event *ev)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(ev->ev_flags & EVLIST_TIMEOUT))) {
		event_errx(1, "%s: %p(fd "EV_SOCK_FMT") not on queue %x", __func__,
		    ev, EV_SOCK_ARG(ev->ev_fd), EVLIST_TIMEOUT);
		return;
	}
	DECR_EVENT_COUNT(base, ev->ev_flags);
	ev->ev_flags &= ~EVLIST_TIMEOUT;

	if (is_common_timeout(&ev->ev_timeout, base)) {
		struct common_timeout_list *ctl =
		    get_common_timeout_list(base, &ev->ev_timeout);
		TAILQ_REMOVE(&ctl->events, ev,
		    ev_timeout_pos.ev_next_with_common_timeout);
	} else {
		min_heap_erase_(&base->timeheap, ev);
	}
}